

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,long element)

{
  type tVar1;
  long local_20;
  long local_18;
  long element_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_18 = element;
  element_local = (long)this;
  AssertScalarT<long>(this);
  Align(this,8);
  local_20 = EndianScalar<long>(local_18);
  vector_downward<unsigned_int>::push_small<long>(&this->buf_,&local_20);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }